

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

bool QApplicationPrivate::sendMouseEvent
               (QWidget *receiver,QMouseEvent *event,QWidget *alienWidget,QWidget *nativeWidget,
               QWidget **buttonDown,QPointer<QWidget> *lastMouseReceiver,bool spontaneous,
               bool onlyDispatchEnterLeave)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidgetData *pQVar5;
  Data *pDVar6;
  QPointF QVar7;
  bool bVar8;
  char cVar9;
  undefined1 uVar10;
  int *piVar11;
  QWidget *pQVar12;
  QWidget *pQVar13;
  Data *pDVar14;
  QPoint QVar15;
  QWidget *pQVar16;
  QWidget *pQVar17;
  long in_FS_OFFSET;
  bool bVar18;
  int iVar25;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  QWidget *local_a0;
  int *local_98;
  QWidget *local_90;
  int *local_80;
  int *local_78;
  undefined1 local_68 [16];
  QPointF local_58;
  double local_48;
  double dStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (alienWidget == (QWidget *)0x0) {
    pQVar17 = (QWidget *)0x0;
  }
  else {
    pQVar17 = (QWidget *)0x0;
    if (((alienWidget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      pQVar17 = alienWidget;
    }
  }
  if (receiver == (QWidget *)0x0) {
    local_80 = (int *)0x0;
  }
  else {
    local_80 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&receiver->super_QObject);
  }
  if (nativeWidget == (QWidget *)0x0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&nativeWidget->super_QObject);
  }
  if (pQVar17 == (QWidget *)0x0) {
    local_78 = (int *)0x0;
  }
  else {
    local_78 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar17->super_QObject);
  }
  pQVar12 = QApplication::activePopupWidget();
  if (pQVar12 == (QWidget *)0x0) {
    local_98 = (int *)0x0;
  }
  else {
    local_98 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar12->super_QObject);
  }
  bVar8 = QWidget::testAttribute_helper(nativeWidget,WA_DontShowOnScreen);
  pQVar5 = receiver->data;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  uVar1 = (pQVar5->crect).x2;
  uVar3 = (pQVar5->crect).y2;
  uVar2 = (pQVar5->crect).x1;
  uVar4 = (pQVar5->crect).y1;
  iVar25 = uVar1 - uVar2;
  auVar19._4_4_ = uVar3 - uVar4;
  auVar19._8_4_ = auVar19._4_4_;
  auVar19._12_4_ = -(uint)(auVar19._4_4_ < 0);
  auVar24._8_4_ = 0xffffffff;
  auVar24._0_8_ = 0xffffffffffffffff;
  auVar24._12_4_ = 0xffffffff;
  local_48 = (double)(CONCAT44(-(uint)(iVar25 < 0),iVar25) + 1);
  dStack_40 = (double)(auVar19._8_8_ - auVar24._8_8_);
  local_68 = QEventPoint::position();
  cVar9 = QRectF::contains(&local_58);
  pDVar14 = leaveAfterRelease.wp.d;
  if (((leaveAfterRelease.wp.d == (Data *)0x0) || (*(int *)(leaveAfterRelease.wp.d + 4) == 0)) ||
     (leaveAfterRelease.wp.value == (QObject *)0x0)) {
LAB_002bd7b1:
    if (*buttonDown != (QWidget *)0x0) goto LAB_002bd7b7;
    pDVar14 = (lastMouseReceiver->wp).d;
    if (((pDVar14 != (Data *)0x0) && (*(int *)(pDVar14 + 4) != 0)) &&
       (local_a0 = (QWidget *)(lastMouseReceiver->wp).value,
       cVar9 == '\x01' && local_a0 != (QWidget *)0x0)) {
      if (pQVar17 == (QWidget *)0x0) {
LAB_002bd869:
        if (((*(int *)(pDVar14 + 4) == 0) || (pQVar17 != (QWidget *)0x0)) ||
           (((local_a0->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) goto LAB_002bd97c;
      }
      else {
        pQVar13 = (QWidget *)0x0;
        if (*(int *)(pDVar14 + 4) != 0) {
          pQVar13 = local_a0;
        }
        if (pQVar13 == pQVar17) goto LAB_002bd869;
      }
      if (((local_98 == (int *)0x0) || (pQVar12 == (QWidget *)0x0)) || (local_98[1] == 0)) {
        if (*(int *)(pDVar14 + 4) == 0) {
          local_a0 = (QWidget *)0x0;
        }
        local_58 = (QPointF)QEventPoint::globalPosition();
        pQVar13 = receiver;
      }
      else {
        pQVar13 = QWidget::mouseGrabber();
        if (pQVar13 != (QWidget *)0x0) goto LAB_002bd97c;
        pQVar13 = pQVar17;
        if (pQVar17 == (QWidget *)0x0) {
          pQVar13 = nativeWidget;
        }
        pDVar14 = (lastMouseReceiver->wp).d;
        if (pDVar14 == (Data *)0x0) {
          local_a0 = (QWidget *)0x0;
        }
        else if (*(int *)(pDVar14 + 4) == 0) {
          local_a0 = (QWidget *)0x0;
        }
        else {
          local_a0 = (QWidget *)(lastMouseReceiver->wp).value;
        }
        local_58 = (QPointF)QEventPoint::globalPosition();
      }
      dispatchEnterLeave(pQVar13,local_a0,&local_58);
    }
  }
  else {
    if (*buttonDown == (QWidget *)0x0) {
      if (*(int *)(event + 0x44) == 0) {
        leaveAfterRelease.wp.d = (Data *)0x0;
        leaveAfterRelease.wp.value = (QObject *)0x0;
        LOCK();
        *(int *)pDVar14 = *(int *)pDVar14 + -1;
        UNLOCK();
        if (*(int *)pDVar14 == 0) {
          operator_delete(pDVar14);
        }
      }
      goto LAB_002bd7b1;
    }
LAB_002bd7b7:
    if (!bVar8) {
      pDVar14 = leaveAfterRelease.wp.d;
      if (((pQVar17 != (QWidget *)0x0) || (receiver->data->winid == 0)) &&
         ((leaveAfterRelease.wp.d == (Data *)0x0 ||
          ((*(int *)(leaveAfterRelease.wp.d + 4) == 0 ||
           (leaveAfterRelease.wp.value == (QObject *)0x0)))))) {
        pQVar13 = QWidget::mouseGrabber();
        pDVar14 = leaveAfterRelease.wp.d;
        if (pQVar13 == (QWidget *)0x0) {
          pQVar13 = *buttonDown;
          if (pQVar13 == (QWidget *)0x0) {
            pDVar14 = (Data *)0x0;
          }
          else {
            pDVar14 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef
                                        (&pQVar13->super_QObject);
          }
          pDVar6 = leaveAfterRelease.wp.d;
          leaveAfterRelease.wp.value = &pQVar13->super_QObject;
          if (leaveAfterRelease.wp.d != (Data *)0x0) {
            LOCK();
            *(int *)leaveAfterRelease.wp.d = *(int *)leaveAfterRelease.wp.d + -1;
            leaveAfterRelease.wp.d = pDVar14;
            UNLOCK();
            pDVar14 = leaveAfterRelease.wp.d;
            if (*(int *)pDVar6 == 0) {
              operator_delete(pDVar6);
              pDVar14 = leaveAfterRelease.wp.d;
            }
          }
        }
      }
      leaveAfterRelease.wp.d = pDVar14;
      if ((*(short *)(event + 8) == 3) && (*(int *)(event + 0x44) == 0)) {
        *buttonDown = (QWidget *)0x0;
      }
    }
  }
LAB_002bd97c:
  if (leaveAfterRelease.wp.d == (Data *)0x0) {
    bVar18 = false;
  }
  else if (*(int *)(leaveAfterRelease.wp.d + 4) == 0) {
    bVar18 = false;
  }
  else {
    bVar18 = leaveAfterRelease.wp.value != (QObject *)0x0;
  }
  uVar10 = 1;
  if (!onlyDispatchEnterLeave) {
    if (spontaneous) {
      uVar10 = QCoreApplication::sendSpontaneousEvent(&receiver->super_QObject,(QEvent *)event);
    }
    else {
      uVar10 = QCoreApplication::sendEvent(&receiver->super_QObject,(QEvent *)event);
    }
  }
  if (((((bVar8) || (leaveAfterRelease.wp.d == (Data *)0x0)) ||
       (*(int *)(leaveAfterRelease.wp.d + 4) == 0)) ||
      ((leaveAfterRelease.wp.value == (QObject *)0x0 || (*(short *)(event + 8) != 3)))) ||
     (*(int *)(event + 0x44) != 0)) {
LAB_002bda34:
    if (bVar18) goto LAB_002bdb88;
    if (((local_98 == (int *)0x0) || (pQVar12 == (QWidget *)0x0)) || (local_98[1] == 0)) {
      if ((local_80 == (int *)0x0) || (local_80[1] == 0)) {
        auVar24 = QEventPoint::globalPosition();
        QVar7 = local_58;
        dVar22 = (double)((ulong)auVar24._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar24._0_8_;
        dVar23 = dVar22;
        if (dVar22 <= -2147483648.0) {
          dVar23 = -2147483648.0;
        }
        dVar20 = (double)((ulong)auVar24._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar24._8_8_;
        dVar21 = dVar20;
        if (dVar20 <= -2147483648.0) {
          dVar21 = -2147483648.0;
        }
        local_58.xp._4_4_ =
             (int)(double)(-(ulong)(2147483647.0 < dVar20) & 0x41dfffffffc00000 |
                          ~-(ulong)(2147483647.0 < dVar20) & (ulong)dVar21);
        local_58.xp._0_4_ =
             (int)(double)(-(ulong)(2147483647.0 < dVar22) & 0x41dfffffffc00000 |
                          ~-(ulong)(2147483647.0 < dVar22) & (ulong)dVar23);
        local_58.yp = QVar7.yp;
        receiver = QApplication::widgetAt((QPoint *)&local_58);
        if (receiver == (QWidget *)0x0) {
          local_90 = (QWidget *)0x0;
          goto LAB_002bdb68;
        }
      }
      goto LAB_002bdb5b;
    }
    pQVar12 = QWidget::mouseGrabber();
    if (pQVar12 == (QWidget *)0x0) {
      if ((((local_78 == (int *)0x0) || (pQVar17 == (QWidget *)0x0)) || (local_78[1] == 0)) &&
         ((piVar11 == (int *)0x0 || (pQVar17 = nativeWidget, piVar11[1] == 0)))) {
        pQVar17 = (QWidget *)0x0;
        pDVar14 = (Data *)0x0;
      }
      else {
        pDVar14 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar17->super_QObject);
      }
      pDVar6 = (lastMouseReceiver->wp).d;
      (lastMouseReceiver->wp).d = pDVar14;
      (lastMouseReceiver->wp).value = &pQVar17->super_QObject;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar6 = *(int *)pDVar6 + -1;
        UNLOCK();
        if (*(int *)pDVar6 == 0) {
          operator_delete(pDVar6);
        }
      }
    }
  }
  else {
    pQVar13 = QWidget::mouseGrabber();
    if ((leaveAfterRelease.wp.d == (Data *)0x0) ||
       (pQVar16 = (QWidget *)leaveAfterRelease.wp.value, *(int *)(leaveAfterRelease.wp.d + 4) == 0))
    {
      pQVar16 = (QWidget *)0x0;
    }
    if (pQVar16 == pQVar13) goto LAB_002bda34;
    if ((piVar11 == (int *)0x0) || (piVar11[1] == 0)) {
      local_58 = (QPointF)QEventPoint::globalPosition();
      QVar15 = QPointF::toPoint(&local_58);
      local_68._0_8_ = QVar15;
      local_90 = QApplication::widgetAt((QPoint *)local_68);
    }
    else {
      local_90 = nativeWidget;
      if (local_78 != (int *)0x0) {
        pQVar12 = nativeWidget;
        if (local_78[1] != 0) {
          pQVar12 = pQVar17;
        }
        local_90 = nativeWidget;
        if (pQVar17 != (QWidget *)0x0) {
          local_90 = pQVar12;
        }
      }
    }
    if ((leaveAfterRelease.wp.d == (Data *)0x0) ||
       (pQVar17 = (QWidget *)leaveAfterRelease.wp.value, *(int *)(leaveAfterRelease.wp.d + 4) == 0))
    {
      pQVar17 = (QWidget *)0x0;
    }
    local_58 = (QPointF)QEventPoint::globalPosition();
    dispatchEnterLeave(local_90,pQVar17,&local_58);
    pDVar14 = leaveAfterRelease.wp.d;
    leaveAfterRelease.wp.d = (Data *)0x0;
    leaveAfterRelease.wp.value = (QObject *)0x0;
    if (pDVar14 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar14 = *(int *)pDVar14 + -1;
      UNLOCK();
      if (*(int *)pDVar14 == 0) {
        operator_delete(pDVar14);
      }
    }
    receiver = local_90;
    if (local_90 == (QWidget *)0x0) {
LAB_002bdb68:
      pDVar14 = (Data *)0x0;
      receiver = local_90;
    }
    else {
LAB_002bdb5b:
      pDVar14 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&receiver->super_QObject);
    }
    pDVar6 = (lastMouseReceiver->wp).d;
    (lastMouseReceiver->wp).d = pDVar14;
    (lastMouseReceiver->wp).value = &receiver->super_QObject;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar6 = *(int *)pDVar6 + -1;
      UNLOCK();
      if (*(int *)pDVar6 == 0) {
        operator_delete(pDVar6);
      }
    }
LAB_002bdb88:
    if (local_98 == (int *)0x0) goto LAB_002bdb9f;
  }
  LOCK();
  *local_98 = *local_98 + -1;
  UNLOCK();
  if (*local_98 == 0) {
    operator_delete(local_98);
  }
LAB_002bdb9f:
  if (local_78 != (int *)0x0) {
    LOCK();
    *local_78 = *local_78 + -1;
    UNLOCK();
    if (*local_78 == 0) {
      operator_delete(local_78);
    }
  }
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      operator_delete(piVar11);
    }
  }
  if (local_80 != (int *)0x0) {
    LOCK();
    *local_80 = *local_80 + -1;
    UNLOCK();
    if (*local_80 == 0) {
      operator_delete(local_80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar10;
}

Assistant:

bool QApplicationPrivate::sendMouseEvent(QWidget *receiver, QMouseEvent *event,
                                         QWidget *alienWidget, QWidget *nativeWidget,
                                         QWidget **buttonDown, QPointer<QWidget> &lastMouseReceiver,
                                         bool spontaneous, bool onlyDispatchEnterLeave)
{
    Q_ASSERT(receiver);
    Q_ASSERT(event);
    Q_ASSERT(nativeWidget);
    Q_ASSERT(buttonDown);

    if (alienWidget && !isAlien(alienWidget))
        alienWidget = nullptr;

    QPointer<QWidget> receiverGuard = receiver;
    QPointer<QWidget> nativeGuard = nativeWidget;
    QPointer<QWidget> alienGuard = alienWidget;
    QPointer<QWidget> activePopupWidget = QApplication::activePopupWidget();

    const bool graphicsWidget = nativeWidget->testAttribute(Qt::WA_DontShowOnScreen);

    bool widgetUnderMouse = QRectF(receiver->rect()).contains(event->position());

    // Clear the obsolete leaveAfterRelease value, if mouse button has been released but
    // leaveAfterRelease has not been updated.
    // This happens e.g. when modal dialog or popup is shown as a response to button click.
    if (leaveAfterRelease && !*buttonDown && !event->buttons())
        leaveAfterRelease = nullptr;

    if (*buttonDown) {
        if (!graphicsWidget) {
            // Register the widget that shall receive a leave event
            // after the last button is released.
            if ((alienWidget || !receiver->internalWinId()) && !leaveAfterRelease && !QWidget::mouseGrabber())
                leaveAfterRelease = *buttonDown;
            if (event->type() == QEvent::MouseButtonRelease && !event->buttons())
                *buttonDown = nullptr;
        }
    } else if (lastMouseReceiver && widgetUnderMouse) {
        // Dispatch enter/leave if we move:
        // 1) from an alien widget to another alien widget or
        //    from a native widget to an alien widget (first OR case)
        // 2) from an alien widget to a native widget (second OR case)
        if ((alienWidget && alienWidget != lastMouseReceiver)
            || (isAlien(lastMouseReceiver) && !alienWidget)) {
            if (activePopupWidget) {
                if (!QWidget::mouseGrabber())
                    dispatchEnterLeave(alienWidget ? alienWidget : nativeWidget, lastMouseReceiver, event->globalPosition());
            } else {
                dispatchEnterLeave(receiver, lastMouseReceiver, event->globalPosition());
            }

        }
    }

    // We need this quard in case someone opens a modal dialog / popup. If that's the case
    // leaveAfterRelease is set to null, but we shall not update lastMouseReceiver.
    const bool wasLeaveAfterRelease = leaveAfterRelease != nullptr;
    bool result = true;
    // This code is used for sending the synthetic enter/leave events for cases where it is needed
    // due to other events causing the widget under the mouse to change. However in those cases
    // we do not want to send the mouse event associated with this call, so this enables us to
    // not send the unneeded mouse event
    if (!onlyDispatchEnterLeave) {
        if (spontaneous)
            result = QApplication::sendSpontaneousEvent(receiver, event);
        else
            result = QCoreApplication::sendEvent(receiver, event);
    }

    if (!graphicsWidget && leaveAfterRelease && event->type() == QEvent::MouseButtonRelease
        && !event->buttons() && QWidget::mouseGrabber() != leaveAfterRelease) {
        // Dispatch enter/leave if:
        // 1) the mouse grabber is an alien widget
        // 2) the button is released on an alien widget
        QWidget *enter = nullptr;
        if (nativeGuard)
            enter = alienGuard ? alienWidget : nativeWidget;
        else // The receiver is typically deleted on mouse release with drag'n'drop.
            enter = QApplication::widgetAt(event->globalPosition().toPoint());
        dispatchEnterLeave(enter, leaveAfterRelease, event->globalPosition());
        leaveAfterRelease = nullptr;
        lastMouseReceiver = enter;
    } else if (!wasLeaveAfterRelease) {
        if (activePopupWidget) {
            if (!QWidget::mouseGrabber())
                lastMouseReceiver = alienGuard ? alienWidget : (nativeGuard ? nativeWidget : nullptr);
        } else {
            lastMouseReceiver = receiverGuard ? receiver : QApplication::widgetAt(event->globalPosition().toPoint());
        }
    }

    return result;
}